

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxVectorBuiltin::FxVectorBuiltin(FxVectorBuiltin *this,FxExpression *self,FName *name)

{
  FName *name_local;
  FxExpression *self_local;
  FxVectorBuiltin *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_VectorBuiltin,&self->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxVectorBuiltin_00a0b280;
  FName::FName(&this->Function);
  this->Self = self;
  FName::operator=(&this->Function,name);
  return;
}

Assistant:

FxVectorBuiltin::FxVectorBuiltin(FxExpression *self, FName name)
	:FxExpression(EFX_VectorBuiltin, self->ScriptPosition)
{
	Self = self;
	Function = name;
}